

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Bitmask exprSelectUsage(WhereMaskSet *pMaskSet,Select *pS)

{
  SrcList *pSVar1;
  Bitmask BVar2;
  Bitmask BVar3;
  Bitmask BVar4;
  Bitmask BVar5;
  Bitmask BVar6;
  long lVar7;
  Select **ppSVar8;
  ulong local_48;
  
  local_48 = 0;
  for (; pS != (Select *)0x0; pS = pS->pPrior) {
    pSVar1 = pS->pSrc;
    BVar2 = sqlite3WhereExprListUsage(pMaskSet,pS->pEList);
    BVar3 = sqlite3WhereExprListUsage(pMaskSet,pS->pGroupBy);
    BVar4 = sqlite3WhereExprListUsage(pMaskSet,pS->pOrderBy);
    BVar5 = sqlite3WhereExprUsage(pMaskSet,pS->pWhere);
    BVar6 = sqlite3WhereExprUsage(pMaskSet,pS->pHaving);
    local_48 = BVar6 | local_48 | BVar5 | BVar4 | BVar3 | BVar2;
    if (pSVar1 != (SrcList *)0x0) {
      ppSVar8 = &pSVar1->a[0].pSelect;
      for (lVar7 = 0; lVar7 < pSVar1->nSrc; lVar7 = lVar7 + 1) {
        BVar2 = exprSelectUsage(pMaskSet,*ppSVar8);
        BVar3 = sqlite3WhereExprUsage(pMaskSet,(Expr *)ppSVar8[4]);
        local_48 = BVar3 | BVar2 | local_48;
        if ((*(byte *)((long)ppSVar8 + 0x15) & 4) != 0) {
          BVar2 = sqlite3WhereExprListUsage
                            (pMaskSet,((anon_union_8_2_996c0f8d_for_u1 *)(ppSVar8 + 7))->pFuncArg);
          local_48 = local_48 | BVar2;
        }
        ppSVar8 = ppSVar8 + 0xe;
      }
    }
  }
  return local_48;
}

Assistant:

static Bitmask exprSelectUsage(WhereMaskSet *pMaskSet, Select *pS){
  Bitmask mask = 0;
  while( pS ){
    SrcList *pSrc = pS->pSrc;
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pEList);
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pGroupBy);
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pOrderBy);
    mask |= sqlite3WhereExprUsage(pMaskSet, pS->pWhere);
    mask |= sqlite3WhereExprUsage(pMaskSet, pS->pHaving);
    if( ALWAYS(pSrc!=0) ){
      int i;
      for(i=0; i<pSrc->nSrc; i++){
        mask |= exprSelectUsage(pMaskSet, pSrc->a[i].pSelect);
        mask |= sqlite3WhereExprUsage(pMaskSet, pSrc->a[i].pOn);
        if( pSrc->a[i].fg.isTabFunc ){
          mask |= sqlite3WhereExprListUsage(pMaskSet, pSrc->a[i].u1.pFuncArg);
        }
      }
    }
    pS = pS->pPrior;
  }
  return mask;
}